

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::assign(Interpreter *this,void *data)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  void *data_local;
  Interpreter *this_local;
  
  puVar1 = (undefined4 *)varAt(this,*data);
  puVar2 = (undefined4 *)offset(data,4);
  *puVar1 = *puVar2;
  return;
}

Assistant:

void Interpreter::assign(void *data) {
#ifdef I_DEBUG
    printf("assigning %f to $%i\n",
           *(float *) offset(data, 4),
           *(unsigned int *) data);
#endif
    memcpy(varAt(*(unsigned int *) data), offset(data, 4), 4);
}